

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Cycle(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *pNew;
  char *pcVar4;
  Abc_Cex_t *local_58;
  int fVerbose;
  int fUseCex;
  int nFrames;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 10;
  bVar1 = false;
  bVar2 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar3 = Extra_UtilGetopt(argc,argv,"Fcvh");
      if (iVar3 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Cycle(): There is no AIG.\n");
          return 1;
        }
        if (bVar1) {
          local_58 = pAbc->pCex;
        }
        else {
          local_58 = (Abc_Cex_t *)0x0;
        }
        pNew = Gia_ManDupCycled(pAbc->pGia,local_58,fVerbose);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      if (iVar3 == 0x46) break;
      if (iVar3 == 99) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if ((iVar3 == 0x68) || (iVar3 != 0x76)) goto LAB_002bc00c;
        bVar2 = (bool)(bVar2 ^ 1);
      }
    }
    if (argc <= globalUtilOptind) break;
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (fVerbose < 0) {
LAB_002bc00c:
      Abc_Print(-2,"usage: &cycle [-F num] [-cvh]\n");
      Abc_Print(-2,"\t         cycles sequential circuit for the given number of timeframes\n");
      Abc_Print(-2,"\t         to derive a new initial state (which may be on the envelope)\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle using PI values from the current CEX [default = %s]\n",pcVar4)
      ;
      pcVar4 = "no";
      if (bVar2) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_002bc00c;
}

Assistant:

int Abc_CommandAbc9Cycle( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, nFrames = 10, fUseCex = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'c':
            fUseCex ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cycle(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManDupCycled( pAbc->pGia, fUseCex ? pAbc->pCex : NULL, nFrames );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cycle [-F num] [-cvh]\n" );
    Abc_Print( -2, "\t         cycles sequential circuit for the given number of timeframes\n" );
    Abc_Print( -2, "\t         to derive a new initial state (which may be on the envelope)\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-c     : toggle using PI values from the current CEX [default = %s]\n", fUseCex? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}